

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O1

void __thiscall MT32Emu::Poly::Poly(Poly *this)

{
  this->part = (Part *)0x0;
  this->key = 0xff;
  this->velocity = 0xff;
  this->sustain = false;
  this->activePartialCount = 0;
  this->partials[0] = (Partial *)0x0;
  this->partials[1] = (Partial *)0x0;
  this->partials[2] = (Partial *)0x0;
  this->partials[3] = (Partial *)0x0;
  this->state = POLY_Inactive;
  this->next = (Poly *)0x0;
  return;
}

Assistant:

Poly::Poly() {
	part = NULL;
	key = 255;
	velocity = 255;
	sustain = false;
	activePartialCount = 0;
	for (int i = 0; i < 4; i++) {
		partials[i] = NULL;
	}
	state = POLY_Inactive;
	next = NULL;
}